

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O3

double __thiscall IF97::Backwards::BackwardsRegion::h_s(BackwardsRegion *this,double s)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (this->N == 0) {
    dVar4 = 0.0;
  }
  else {
    dVar1 = this->s_star;
    dVar2 = this->s2_star;
    dVar4 = 0.0;
    uVar3 = 0;
    do {
      dVar7 = (this->n).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3];
      dVar5 = pow(s / dVar1,this->d);
      dVar5 = pow(dVar5 + this->a,
                  (this->I).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3]);
      dVar6 = pow(this->b + s / dVar2,
                  (this->J).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3]);
      dVar4 = dVar4 + dVar6 * dVar5 * dVar7;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->N);
  }
  dVar1 = this->e;
  dVar7 = pow(dVar4,this->c);
  dVar2 = this->e;
  dVar4 = exp(dVar4);
  return (dVar4 * dVar2 + dVar7 * (1.0 - dVar1)) * this->h_star;
}

Assistant:

virtual double h_s(double s) const{
                const double sigma1 = s/s_star, sigma2 = s/s2_star;
                double summer = 0;
                for (std::size_t i = 0; i < N; ++i){
                    summer += n[i]*std::pow(std::pow(sigma1,d)+a, I[i])*std::pow(sigma2+b, J[i]);
                }
                // NOTE: c=1, e=0 : Straight summation
                //       c>1, e=0 : Power fit
                //       c=1, e=1 : Exp fit
                return ( (1-e)*std::pow(summer,c) + e*exp(summer) )*h_star;
            }